

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::SPxMainSM<double>::removeEmpty(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  VectorBase<double> *pVVar1;
  double dVar2;
  int *piVar3;
  SPxOut *pSVar4;
  char cVar5;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  EmptyConstraintPS *pEVar6;
  VectorBase<double> *pVVar7;
  FixVariablePS *this_01;
  int j;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr2;
  double local_d0;
  int local_c0;
  int local_bc;
  value_type local_b8;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *local_a8;
  VectorBase<double> *local_a0;
  value_type local_98;
  shared_ptr<soplex::Tolerances> local_88;
  shared_ptr<soplex::Tolerances> local_78;
  shared_ptr<soplex::Tolerances> local_68;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  lVar8 = (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_c0 = 0;
  local_bc = 0;
  if (0 < lVar8) {
    local_a8 = &this->m_hist;
    uVar9 = lVar8 + 1;
    local_bc = 0;
    do {
      if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[uVar9 - 2].idx].data.
          super_SVectorBase<double>.memused == 0) {
        dVar2 = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar9 - 2];
        dVar10 = feastol(this);
        if (dVar2 < -dVar10) {
          return INFEASIBLE;
        }
        dVar2 = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar9 - 2];
        dVar10 = feastol(this);
        if (dVar10 < dVar2) {
          return INFEASIBLE;
        }
        pEVar6 = (EmptyConstraintPS *)operator_new(0x38);
        local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        EmptyConstraintPS::EmptyConstraintPS(pEVar6,lp,(int)(uVar9 - 2),&local_68);
        local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pEVar6;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<double>::EmptyConstraintPS*>
                  (&local_b8.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,pEVar6);
        if (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
        ::push_back(&local_a8->data,&local_b8);
        piVar3 = (this->m_rIdx).data;
        piVar3[uVar9 - 2] =
             piVar3[(long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xf])
                  (lp,uVar9 - 2 & 0xffffffff);
        piVar3 = (this->m_stat).data;
        *piVar3 = *piVar3 + 1;
        if (local_b8.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_bc = local_bc + 1;
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  lVar8 = (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < lVar8) {
    local_a0 = &(lp->super_LPColSetBase<double>).low;
    pVVar1 = &(lp->super_LPColSetBase<double>).up;
    local_48 = *(double *)(in_FS_OFFSET + -8);
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    local_a8 = &this->m_hist;
    uVar9 = lVar8 + 1;
    local_c0 = 0;
    do {
      if ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar9 - 2].idx].data.
          super_SVectorBase<double>.memused == 0) {
        dVar2 = (lp->super_LPColSetBase<double>).object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar9 - 2];
        dVar10 = epsZero(this);
        if (dVar2 <= dVar10) {
          dVar2 = (lp->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 - 2];
          dVar11 = epsZero(this);
          dVar10 = (lp->super_LPColSetBase<double>).low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9 - 2];
          if (dVar2 < -dVar11) {
            ::soplex::infinity::__tls_init();
            pVVar7 = local_a0;
            if (dVar10 <= local_58) {
              return UNBOUNDED;
            }
            goto LAB_001fe035;
          }
          ::soplex::infinity::__tls_init();
          pVVar7 = local_a0;
          if (local_58 < dVar10) goto LAB_001fe035;
          dVar2 = (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 - 2];
          ::soplex::infinity::__tls_init();
          local_d0 = 0.0;
          pVVar7 = pVVar1;
          if (dVar2 < local_48) goto LAB_001fe035;
        }
        else {
          dVar2 = (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 - 2];
          ::soplex::infinity::__tls_init();
          pVVar7 = pVVar1;
          if (local_48 <= dVar2) {
            return UNBOUNDED;
          }
LAB_001fe035:
          local_d0 = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9 - 2];
        }
        pEVar6 = (EmptyConstraintPS *)operator_new(0x30);
        local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        j = (int)(uVar9 - 2);
        FixBoundsPS::FixBoundsPS((FixBoundsPS *)pEVar6,lp,j,local_d0,&local_78);
        local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pEVar6;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                  (&local_b8.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(FixBoundsPS *)pEVar6);
        if (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_01 = (FixVariablePS *)operator_new(0x78);
        local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        FixVariablePS::FixVariablePS(this_01,lp,this,j,local_d0,&local_88,true);
        local_98.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this_01;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<double>::FixVariablePS*>
                  (&local_98.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,this_01);
        if (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_00 = local_a8;
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
        ::push_back(&local_a8->data,&local_b8);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
        ::push_back(&this_00->data,&local_98);
        piVar3 = (this->m_cIdx).data;
        piVar3[uVar9 - 2] =
             piVar3[(long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x15])
                  (lp,uVar9 - 2 & 0xffffffff);
        piVar3 = (this->m_stat).data + 4;
        *piVar3 = *piVar3 + 1;
        if (local_98.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_b8.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_c0 = local_c0 + 1;
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  if (local_c0 + local_bc != 0 && SCARRY4(local_c0,local_bc) == local_c0 + local_bc < 0) {
    piVar3 = &(this->super_SPxSimplifier<double>).m_remRows;
    *piVar3 = *piVar3 + local_bc;
    piVar3 = &(this->super_SPxSimplifier<double>).m_remCols;
    *piVar3 = *piVar3 + local_c0;
    pSVar4 = (this->super_SPxSimplifier<double>).spxout;
    if ((pSVar4 != (SPxOut *)0x0) && (3 < (int)pSVar4->m_verbosity)) {
      local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               CONCAT44(local_b8.
                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,pSVar4->m_verbosity);
      local_98.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               CONCAT44(local_98.
                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,4);
      (*pSVar4->_vptr_SPxOut[2])();
      pSVar4 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity],"Simplifier (empty rows/colums) removed ",
                 0x27);
      std::ostream::operator<<((ostream *)pSVar4->m_streams[pSVar4->m_verbosity],local_bc);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar4->m_streams[pSVar4->m_verbosity],local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar4->m_streams[pSVar4->m_verbosity]," cols",5);
      cVar5 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18)
                      + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      pSVar4 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar4->_vptr_SPxOut[2])(pSVar4,&local_b8);
    }
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}